

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

Script * __thiscall
cfd::core::ScriptBuilder::Build(Script *__return_storage_ptr__,ScriptBuilder *this)

{
  size_t sVar1;
  undefined8 uVar2;
  Script *pSVar3;
  CfdError error_code;
  CfdException *this_00;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined1 local_30 [8];
  ByteData data;
  ScriptBuilder *this_local;
  
  this_00 = (CfdException *)local_30;
  pSVar3 = __return_storage_ptr__;
  data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ByteData::ByteData((ByteData *)this_00,&this->script_byte_array_);
  sVar1 = ByteData::GetDataSize((ByteData *)this_00);
  if (10000 < sVar1) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_script.cpp"
                 ,0x2f);
    error_code = (CfdError)((ulong)pSVar3 >> 0x20);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x558;
    local_58.funcname = "Build";
    logger::warn<>(&local_58,"Script size is over.");
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_78,"Script size is over.",&local_79);
    CfdException::CfdException(this_00,error_code,(string *)__return_storage_ptr__);
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Script::Script(__return_storage_ptr__,(ByteData *)local_30);
  ByteData::~ByteData((ByteData *)0x40110d);
  return pSVar3;
}

Assistant:

Script ScriptBuilder::Build() {
  ByteData data(script_byte_array_);
  if (data.GetDataSize() > Script::kMaxScriptSize) {
    warn(CFD_LOG_SOURCE, "Script size is over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Script size is over.");
  }

  return Script(data);
}